

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSubsetHB.c
# Opt level: O1

DdNode * cuddSubsetHeavyBranch(DdManager *dd,DdNode *f,int numVars,int threshold)

{
  int *piVar1;
  double *pdVar2;
  double **ppdVar3;
  NodeData_t **ppNVar4;
  int iVar5;
  int iVar6;
  st__table *table;
  NodeData_t *pNVar7;
  NodeData_t *__ptr;
  NodeData_t *pNVar8;
  NodeData_t *pNVar9;
  int **ppiVar10;
  NodeData_t **ppNVar11;
  NodeData_t **ppNVar12;
  int *piVar13;
  st__table *table_00;
  DdNode *pDVar14;
  st__table *approxTable;
  st__generator *psVar15;
  ulong uVar16;
  long lVar17;
  NodeData_t ***pppNVar18;
  int ***pppiVar19;
  double max;
  char *value;
  char *key;
  NodeData_t *currNodeQual;
  NodeData_t ***local_68;
  DdNode *local_50;
  DdNode *local_48;
  int **local_40;
  char *local_38;
  
  if (f == (DdNode *)0x0) {
    fwrite("Cannot subset, nil object\n",0x1a,1,(FILE *)dd->err);
    dd->errorCode = CUDD_INVALID_ARG;
    return (DdNode *)0x0;
  }
  one = Cudd_ReadOne(dd);
  zero = (DdNode *)((ulong)one ^ 1);
  iVar5 = 0x3ff;
  if (numVars != 0) {
    iVar5 = numVars;
  }
  if (*(int *)((ulong)f & 0xfffffffffffffffe) == 0x7fffffff) {
    return f;
  }
  ::max = ldexp(1.0,iVar5);
  ::max = ldexp(1.0,iVar5);
  table = st__init_table(st__ptrcmp,st__ptrhash);
  if (table == (st__table *)0x0) {
LAB_007e0f78:
    memOut = 1;
    table = (st__table *)0x0;
  }
  else {
    maxPages = 0x80;
    pNVar7 = (NodeData_t *)malloc(0x400);
    mintermPages = (double **)pNVar7;
    if (pNVar7 == (NodeData_t *)0x0) {
LAB_007e0f70:
      st__free_table(table);
      goto LAB_007e0f78;
    }
    page = 0;
    __ptr = (NodeData_t *)malloc(0x4000);
    currentMintermPage = (double *)__ptr;
    pNVar7->mintermPointer = (double *)__ptr;
    if (__ptr == (NodeData_t *)0x0) {
      local_68 = (NodeData_t ***)&mintermPages;
LAB_007e0f60:
      free(pNVar7);
      *local_68 = (NodeData_t **)0x0;
      goto LAB_007e0f70;
    }
    pageIndex = 0;
    maxNodeDataPages = 0x80;
    pNVar8 = (NodeData_t *)malloc(0x400);
    nodeDataPages = (NodeData_t **)pNVar8;
    if (pNVar8 == (NodeData_t *)0x0) {
      local_68 = (NodeData_t ***)&mintermPages;
      pNVar8 = pNVar7;
LAB_007e0f43:
      free(__ptr);
      pNVar7->mintermPointer = (double *)0x0;
      pNVar7 = pNVar8;
      goto LAB_007e0f60;
    }
    nodeDataPage = 0;
    pNVar9 = (NodeData_t *)malloc(0x6000);
    currentNodeDataPage = pNVar9;
    pNVar8->mintermPointer = (double *)pNVar9;
    if (pNVar9 == (NodeData_t *)0x0) {
      free(__ptr);
      pNVar7->mintermPointer = (double *)0x0;
      local_68 = &nodeDataPages;
      __ptr = pNVar7;
      pNVar7 = (NodeData_t *)&mintermPages;
      goto LAB_007e0f43;
    }
    nodeDataPageIndex = 0;
    SubsetCountMintermAux(f,::max,table);
    if (memOut != 0) goto LAB_007e0f78;
  }
  if ((table != (st__table *)0x0) && ((memOut & 1) == 0)) {
    max = ldexp(1.0,iVar5);
    maxPages = 0x80;
    ::max = max;
    ppiVar10 = (int **)malloc(0x400);
    nodePages = ppiVar10;
    if (ppiVar10 == (int **)0x0) {
LAB_007e129c:
      memOut = 1;
      iVar5 = 0;
    }
    else {
      ppNVar11 = (NodeData_t **)malloc(0x400);
      ppdVar3 = mintermPages;
      lightNodePages = (int **)ppNVar11;
      if (ppNVar11 == (NodeData_t **)0x0) {
        uVar16 = (ulong)(uint)page;
        if (-1 < page) {
          lVar17 = 0;
          do {
            pdVar2 = ppdVar3[lVar17];
            if (pdVar2 != (double *)0x0) {
              free(pdVar2);
              ppdVar3[lVar17] = (double *)0x0;
            }
            lVar17 = lVar17 + 1;
          } while (uVar16 + 1 != lVar17);
        }
        if (mintermPages != (double **)0x0) {
          free(mintermPages);
          mintermPages = (double **)0x0;
        }
        ppNVar11 = nodeDataPages;
        uVar16 = (ulong)(uint)nodeDataPage;
        if (-1 < nodeDataPage) {
          lVar17 = 0;
          do {
            pNVar7 = ppNVar11[lVar17];
            if (pNVar7 != (NodeData_t *)0x0) {
              free(pNVar7);
              ppNVar11[lVar17] = (NodeData_t *)0x0;
            }
            lVar17 = lVar17 + 1;
          } while (uVar16 + 1 != lVar17);
        }
        if (nodeDataPages != (NodeData_t **)0x0) {
          ppNVar11 = nodeDataPages;
          pppiVar19 = (int ***)&nodeDataPages;
          goto LAB_007e1275;
        }
LAB_007e1284:
        free(ppiVar10);
        nodePages = (int **)0x0;
        goto LAB_007e129c;
      }
      page = 0;
      ppNVar12 = (NodeData_t **)malloc(0x2000);
      *ppiVar10 = (int *)ppNVar12;
      ppdVar3 = mintermPages;
      currentNodePage = (int *)ppNVar12;
      if (ppNVar12 == (NodeData_t **)0x0) {
        if (*mintermPages != (double *)0x0) {
          free(*mintermPages);
          *ppdVar3 = (double *)0x0;
        }
        free(ppdVar3);
        ppNVar12 = nodeDataPages;
        mintermPages = (double **)0x0;
        uVar16 = (ulong)(uint)nodeDataPage;
        if (-1 < nodeDataPage) {
          lVar17 = 0;
          do {
            pNVar7 = ppNVar12[lVar17];
            if (pNVar7 != (NodeData_t *)0x0) {
              free(pNVar7);
              ppNVar12[lVar17] = (NodeData_t *)0x0;
            }
            lVar17 = lVar17 + 1;
          } while (uVar16 + 1 != lVar17);
        }
        if (nodeDataPages == (NodeData_t **)0x0) {
          pppiVar19 = &lightNodePages;
          goto LAB_007e1275;
        }
        pppNVar18 = &nodeDataPages;
        ppNVar12 = nodeDataPages;
LAB_007e124c:
        free(ppNVar12);
        *pppNVar18 = (NodeData_t **)0x0;
        pppiVar19 = &lightNodePages;
LAB_007e1275:
        free(ppNVar11);
        *pppiVar19 = (int **)0x0;
        goto LAB_007e1284;
      }
      currentLightNodePage = (int *)malloc(0x2000);
      *ppNVar11 = (NodeData_t *)currentLightNodePage;
      ppdVar3 = mintermPages;
      if ((NodeData_t *)currentLightNodePage == (NodeData_t *)0x0) {
        local_40 = ppiVar10;
        if (*mintermPages != (double *)0x0) {
          free(*mintermPages);
          *ppdVar3 = (double *)0x0;
        }
        free(ppdVar3);
        ppNVar4 = nodeDataPages;
        mintermPages = (double **)0x0;
        uVar16 = (ulong)(uint)nodeDataPage;
        if (-1 < nodeDataPage) {
          lVar17 = 0;
          do {
            pNVar7 = ppNVar4[lVar17];
            if (pNVar7 != (NodeData_t *)0x0) {
              free(pNVar7);
              ppNVar4[lVar17] = (NodeData_t *)0x0;
            }
            lVar17 = lVar17 + 1;
          } while (uVar16 + 1 != lVar17);
        }
        ppiVar10 = local_40;
        pppNVar18 = (NodeData_t ***)&currentNodePage;
        if (nodeDataPages != (NodeData_t **)0x0) {
          free(nodeDataPages);
          nodeDataPages = (NodeData_t **)0x0;
          ppiVar10 = local_40;
        }
        goto LAB_007e124c;
      }
      pageIndex = 0;
      iVar5 = SubsetCountNodesAux(f,table,max);
      if (memOut != 0) goto LAB_007e129c;
    }
    if (memOut != 1) {
      iVar6 = st__lookup(table,(char *)f,&local_38);
      if (iVar6 == 0) {
        fwrite("Something is wrong, ought to be node quality table\n",0x33,1,(FILE *)dd->err);
        dd->errorCode = CUDD_INTERNAL_ERROR;
      }
      piVar13 = (int *)malloc(4);
      if (piVar13 != (int *)0x0) {
        *piVar13 = iVar5;
        table_00 = st__init_table(st__ptrcmp,st__ptrhash);
        piVar1 = (int *)(((ulong)one & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        pDVar14 = Cudd_ReadOne(dd);
        iVar5 = st__insert(table_00,(char *)pDVar14,(char *)0x0);
        if (iVar5 == -10000) {
          fwrite("Something wrong, st__table insert failed\n",0x29,1,(FILE *)dd->out);
        }
        approxTable = st__init_table(st__ptrcmp,st__ptrhash);
        pDVar14 = BuildSubsetBdd(dd,f,piVar13,table,threshold,table_00,approxTable);
        if (pDVar14 != (DdNode *)0x0) {
          piVar1 = (int *)(((ulong)pDVar14 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
        }
        psVar15 = st__init_gen(approxTable);
        if (psVar15 != (st__generator *)0x0) {
          iVar5 = st__gen(psVar15,(char **)&local_48,(char **)&local_50);
          if (iVar5 != 0) {
            do {
              Cudd_RecursiveDeref(dd,local_50);
              iVar5 = st__gen(psVar15,(char **)&local_48,(char **)&local_50);
            } while (iVar5 != 0);
          }
          st__free_gen(psVar15);
          st__free_table(approxTable);
          psVar15 = st__init_gen(table_00);
          approxTable = table_00;
          if (psVar15 != (st__generator *)0x0) {
            iVar5 = st__gen(psVar15,(char **)&local_48,(char **)&local_50);
            if (iVar5 != 0) {
              do {
                Cudd_RecursiveDeref(dd,local_48);
                iVar5 = st__gen(psVar15,(char **)&local_48,(char **)&local_50);
              } while (iVar5 != 0);
            }
            st__free_gen(psVar15);
            st__free_table(table_00);
            ppdVar3 = mintermPages;
            iVar5 = page;
            uVar16 = (ulong)(uint)page;
            if (-1 < page) {
              lVar17 = 0;
              do {
                pdVar2 = ppdVar3[lVar17];
                if (pdVar2 != (double *)0x0) {
                  free(pdVar2);
                  ppdVar3[lVar17] = (double *)0x0;
                }
                lVar17 = lVar17 + 1;
              } while (uVar16 + 1 != lVar17);
            }
            if (mintermPages != (double **)0x0) {
              free(mintermPages);
              mintermPages = (double **)0x0;
            }
            ppiVar10 = nodePages;
            if (-1 < iVar5) {
              lVar17 = 0;
              do {
                piVar1 = ppiVar10[lVar17];
                if (piVar1 != (int *)0x0) {
                  free(piVar1);
                  ppiVar10[lVar17] = (int *)0x0;
                }
                lVar17 = lVar17 + 1;
              } while (uVar16 + 1 != lVar17);
            }
            if (nodePages != (int **)0x0) {
              free(nodePages);
              nodePages = (int **)0x0;
            }
            ppiVar10 = lightNodePages;
            if (-1 < iVar5) {
              uVar16 = 0;
              do {
                piVar1 = ppiVar10[uVar16];
                if (piVar1 != (int *)0x0) {
                  free(piVar1);
                  ppiVar10[uVar16] = (int *)0x0;
                }
                uVar16 = uVar16 + 1;
              } while (iVar5 + 1 != uVar16);
            }
            if (lightNodePages != (int **)0x0) {
              free(lightNodePages);
              lightNodePages = (int **)0x0;
            }
            ppNVar11 = nodeDataPages;
            uVar16 = (ulong)(uint)nodeDataPage;
            if (-1 < nodeDataPage) {
              lVar17 = 0;
              do {
                pNVar7 = ppNVar11[lVar17];
                if (pNVar7 != (NodeData_t *)0x0) {
                  free(pNVar7);
                  ppNVar11[lVar17] = (NodeData_t *)0x0;
                }
                lVar17 = lVar17 + 1;
              } while (uVar16 + 1 != lVar17);
            }
            if (nodeDataPages != (NodeData_t **)0x0) {
              free(nodeDataPages);
              nodeDataPages = (NodeData_t **)0x0;
            }
            st__free_table(table);
            free(piVar13);
            if (pDVar14 == (DdNode *)0x0) {
              return (DdNode *)0x0;
            }
            piVar13 = (int *)(((ulong)pDVar14 & 0xfffffffffffffffe) + 4);
            *piVar13 = *piVar13 + -1;
            return pDVar14;
          }
        }
        st__free_table(approxTable);
        return (DdNode *)0x0;
      }
      goto LAB_007e12cb;
    }
  }
  fwrite("Out-of-memory; Cannot subset\n",0x1d,1,(FILE *)dd->err);
LAB_007e12cb:
  dd->errorCode = CUDD_MEMORY_OUT;
  return (DdNode *)0x0;
}

Assistant:

DdNode *
cuddSubsetHeavyBranch(
  DdManager * dd /* DD manager */,
  DdNode * f /* current DD */,
  int  numVars /* maximum number of variables */,
  int  threshold /* threshold size for the subset */)
{

    int i, *size;
    st__table *visitedTable;
    int numNodes;
    NodeData_t *currNodeQual;
    DdNode *subset;
    st__table *storeTable, *approxTable;
    char *key, *value;
    st__generator *stGen;

    if (f == NULL) {
        fprintf(dd->err, "Cannot subset, nil object\n");
        dd->errorCode = CUDD_INVALID_ARG;
        return(NULL);
    }

    one  = Cudd_ReadOne(dd);
    zero = Cudd_Not(one);

    /* If user does not know numVars value, set it to the maximum
     * exponent that the pow function can take. The -1 is due to the
     * discrepancy in the value that pow takes and the value that
     * log gives.
     */
    if (numVars == 0) {
        /* set default value */
        numVars = DBL_MAX_EXP - 1;
    }

    if (Cudd_IsConstant(f)) {
        return(f);
    }

    max = pow(2.0, (double)numVars);

    /* Create visited table where structures for node data are allocated and
       stored in a st__table */
    visitedTable = SubsetCountMinterm(f, numVars);
    if ((visitedTable == NULL) || memOut) {
        (void) fprintf(dd->err, "Out-of-memory; Cannot subset\n");
        dd->errorCode = CUDD_MEMORY_OUT;
        return(0);
    }
    numNodes = SubsetCountNodes(f, visitedTable, numVars);
    if (memOut) {
        (void) fprintf(dd->err, "Out-of-memory; Cannot subset\n");
        dd->errorCode = CUDD_MEMORY_OUT;
        return(0);
    }

    if ( st__lookup(visitedTable, (const char *)f, (char **)&currNodeQual) == 0) {
        fprintf(dd->err,
                "Something is wrong, ought to be node quality table\n");
        dd->errorCode = CUDD_INTERNAL_ERROR;
    }

    size = ABC_ALLOC(int, 1);
    if (size == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    *size = numNodes;

#ifdef DEBUG
    num_calls = 0;
#endif
    /* table to store nodes being created. */
    storeTable = st__init_table( st__ptrcmp, st__ptrhash);
    /* insert the constant */
    cuddRef(one);
    if ( st__insert(storeTable, (char *)Cudd_ReadOne(dd), NIL(char)) ==
        st__OUT_OF_MEM) {
        fprintf(dd->out, "Something wrong, st__table insert failed\n");
    }
    /* table to store approximations of nodes */
    approxTable = st__init_table( st__ptrcmp, st__ptrhash);
    subset = (DdNode *)BuildSubsetBdd(dd, f, size, visitedTable, threshold,
                                      storeTable, approxTable);
    if (subset != NULL) {
        cuddRef(subset);
    }

    stGen = st__init_gen(approxTable);
    if (stGen == NULL) {
        st__free_table(approxTable);
        return(NULL);
    }
    while( st__gen(stGen, (const char **)&key, (char **)&value)) {
        Cudd_RecursiveDeref(dd, (DdNode *)value);
    }
    st__free_gen(stGen); stGen = NULL;
    st__free_table(approxTable);

    stGen = st__init_gen(storeTable);
    if (stGen == NULL) {
        st__free_table(storeTable);
        return(NULL);
    }
    while( st__gen(stGen, (const char **)&key, (char **)&value)) {
        Cudd_RecursiveDeref(dd, (DdNode *)key);
    }
    st__free_gen(stGen); stGen = NULL;
    st__free_table(storeTable);

    for (i = 0; i <= page; i++) {
        ABC_FREE(mintermPages[i]);
    }
    ABC_FREE(mintermPages);
    for (i = 0; i <= page; i++) {
        ABC_FREE(nodePages[i]);
    }
    ABC_FREE(nodePages);
    for (i = 0; i <= page; i++) {
        ABC_FREE(lightNodePages[i]);
    }
    ABC_FREE(lightNodePages);
    for (i = 0; i <= nodeDataPage; i++) {
        ABC_FREE(nodeDataPages[i]);
    }
    ABC_FREE(nodeDataPages);
    st__free_table(visitedTable);
    ABC_FREE(size);
#if 0
    (void) Cudd_DebugCheck(dd);
    (void) Cudd_CheckKeys(dd);
#endif

    if (subset != NULL) {
#ifdef DD_DEBUG
      if (!Cudd_bddLeq(dd, subset, f)) {
            fprintf(dd->err, "Wrong subset\n");
            dd->errorCode = CUDD_INTERNAL_ERROR;
            return(NULL);
      }
#endif
        cuddDeref(subset);
        return(subset);
    } else {
        return(NULL);
    }
}